

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall ACSStringPool::PurgeStrings(ACSStringPool *this)

{
  uint *__s;
  byte *pbVar1;
  PoolEntry *pPVar2;
  uint uVar3;
  ulong uVar4;
  FString *this_00;
  long lVar5;
  
  __s = this->PoolBuckets;
  memset(__s,0xff,0x3ec);
  if ((this->Pool).Count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pPVar2 = (this->Pool).Array;
      if (*(int *)((long)&pPVar2->Next + lVar5) != -2) {
        if (*(int *)((long)&pPVar2->LockCount + lVar5) == 0) {
          this_00 = (FString *)((long)&(pPVar2->Str).Chars + lVar5);
          *(undefined4 *)((long)&this_00[1].Chars + 4) = 0xfffffffe;
          if (uVar4 < this->FirstFreeEntry) {
            this->FirstFreeEntry = (uint)uVar4;
          }
          FString::operator=(this_00,(char *)"");
        }
        else {
          uVar3 = *(uint *)((long)&pPVar2->Hash + lVar5) % 0xfb;
          *(uint *)((long)&pPVar2->Next + lVar5) = __s[uVar3];
          __s[uVar3] = (uint)uVar4;
          pbVar1 = (byte *)((long)&pPVar2->LockCount + lVar5 + 3);
          *pbVar1 = *pbVar1 & 0x7f;
        }
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < (this->Pool).Count);
  }
  return;
}

Assistant:

void ACSStringPool::PurgeStrings()
{
	// Clear the hash buckets. We'll rebuild them as we decide what strings
	// to keep and which to toss.
	memset(PoolBuckets, 0xFF, sizeof(PoolBuckets));
	size_t usedcount = 0, freedcount = 0;
	for (unsigned int i = 0; i < Pool.Size(); ++i)
	{
		PoolEntry *entry = &Pool[i];
		if (entry->Next != FREE_ENTRY)
		{
			if (entry->LockCount == 0)
			{
				freedcount++;
				// Mark this entry as free.
				entry->Next = FREE_ENTRY;
				if (i < FirstFreeEntry)
				{
					FirstFreeEntry = i;
				}
				// And free the string.
				entry->Str = "";
			}
			else
			{
				usedcount++;
				// Rehash this entry.
				unsigned int h = entry->Hash % NUM_BUCKETS;
				entry->Next = PoolBuckets[h];
				PoolBuckets[h] = i;
				// Remove MarkString's mark.
				entry->LockCount &= 0x7FFFFFFF;
			}
		}
	}
}